

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowLayout::setStatusBar(QMainWindowLayout *this,QStatusBar *sb)

{
  QWidgetItemV2 *in_RSI;
  QWidget *in_RDI;
  QLayout *unaff_retaddr;
  void *local_28;
  
  if (in_RSI != (QWidgetItemV2 *)0x0) {
    QLayout::addChildWidget(unaff_retaddr,in_RDI);
  }
  if (*(long **)(in_RDI + 0x2d) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x2d) + 8))();
  }
  if (in_RSI == (QWidgetItemV2 *)0x0) {
    local_28 = (void *)0x0;
  }
  else {
    local_28 = operator_new(0x58);
    QWidgetItemV2::QWidgetItemV2(in_RSI,in_RDI);
  }
  *(void **)(in_RDI + 0x2d) = local_28;
  (**(code **)(*(long *)in_RDI + 0x70))();
  return;
}

Assistant:

void QMainWindowLayout::setStatusBar(QStatusBar *sb)
{
    if (sb)
        addChildWidget(sb);
    delete statusbar;
    statusbar = sb ? new QWidgetItemV2(sb) : nullptr;
    invalidate();
}